

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O1

int conn_send(conn_handle *conn,uint8_t *buff,size_t buff_len)

{
  void *pvVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  
  iVar2 = -0x5b;
  if (conn->type == CONN_TYPE_TCP) {
    pvVar1 = conn->priv;
    mutex_lock_shared((mutex_handle *)((long)pvVar1 + 0x90));
    if (*(int *)((long)pvVar1 + 8) == -1) {
      iVar2 = -0x6b;
    }
    else {
      iVar2 = 0;
      if (buff_len != 0) {
        do {
          sVar3 = send(*(int *)((long)pvVar1 + 8),buff,buff_len & 0xffffffff,0x4000);
          iVar2 = (int)sVar3;
          if (iVar2 == 0) {
            iVar2 = -0x20;
            break;
          }
          if (iVar2 == -1) {
            piVar4 = __errno_location();
            iVar2 = -*piVar4;
            break;
          }
          buff_len = buff_len - (long)iVar2;
          iVar2 = 0;
        } while (buff_len != 0);
      }
    }
    mutex_unlock_shared((mutex_handle *)((long)pvVar1 + 0x90));
  }
  return iVar2;
}

Assistant:

int conn_send(struct conn_handle *conn, const uint8_t *buff, size_t buff_len)
{
	struct conn_priv *priv = conn->priv;
	int ret;

	if (conn->type != CONN_TYPE_TCP)
		return -EPROTOTYPE;

	mutex_lock_shared(&priv->mutex);

	if (priv->fd != INVALID_SOCKET) {
		while (buff_len > 0) {
			/*! @TODO Bug? buff isn't changed */
			ret = send(priv->fd, (const char *)buff, (socklen_t)buff_len,
				   MSG_NOSIGNAL);

			if (ret == 0) {
				ret = -EPIPE;

				goto conn_send_exit;
			} else if (ret == SOCKET_ERROR) {
				ret = SOCK_ERRNO;

#ifdef _WIN32
				if (ret == -WSAESHUTDOWN)
					ret = -EPIPE;

#endif

				goto conn_send_exit;
			}

			buff_len -= ret;
		}

		ret = 0;
	} else {
		ret = -ENOTCONN;
	}

conn_send_exit:
	mutex_unlock_shared(&priv->mutex);

	return ret;
}